

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multihash_test.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_b0ec::Binary_DecodeUvarInt_Test::~Binary_DecodeUvarInt_Test
          (Binary_DecodeUvarInt_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Binary, DecodeUvarInt) {
	multihash::Bytes buf{};
	multihash::UInt val{};
	multihash::OptError optErr{};

	// read values
	buf = {0x11, 0xFF, 0x01};
	std::tie(val, optErr) = binary::uvarint(buf); // first value
	ASSERT_FALSE(optErr) << "Expected no error. error: '" << optErr.value() << "'";
	EXPECT_EQ(0x11, val);

	std::tie(val, optErr) = binary::uvarint(buf); // second value
	ASSERT_FALSE(optErr) << "Expected no error. error: '" << optErr.value() << "'";
	EXPECT_EQ(0xFF, val);

	// empty buffer
	buf = {};
	std::tie(val, optErr) = binary::uvarint(buf);
	ASSERT_TRUE(optErr) << "Expected an error. expected: '" << multihash::errVarIntBufferTooShort << "'";
	ASSERT_EQ(multihash::errVarIntBufferTooShort, optErr.value());
	EXPECT_EQ(0, val);

	// value overflow
	buf = {0x80, 0x80, 0x80, 0x80, 0x80, 0x80, 0x80, 0x80, 0x80, 0x02};
	std::tie(val, optErr) = binary::uvarint(buf);
	ASSERT_TRUE(optErr) << "Expected an error. expected: '" << multihash::errVarIntTooLong << "'";
	ASSERT_EQ(multihash::errVarIntTooLong, optErr.value());
	EXPECT_EQ(0, val);
}